

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O2

int report(string *test,string *error,int columns)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  
  lVar1 = std::cerr;
  *(undefined8 *)((long)&Gecko::version_string + *(long *)(std::cerr + -0x18)) = 0x14;
  *(uint *)(std::ios_base::Init::~Init + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ios_base::Init::~Init + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)test);
  std::operator<<(poVar2," ");
  bVar3 = error->_M_string_length == 0;
  if (bVar3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ OK ]");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[FAIL] ");
    poVar2 = std::operator<<(poVar2,(string *)error);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return (uint)!bVar3;
}

Assistant:

static int
report(std::string test, std::string error, int columns = 20)
{
  std::cerr << std::setw(columns) << std::left << test << " ";
  if (error.empty()) {
    std::cerr << "[ OK ]" << std::endl;
    return 0;
  }
  else {
    std::cerr << "[FAIL] " << error << std::endl;
    return 1;
  }
}